

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O0

QStringList * xdgDataDirs(void)

{
  initializer_list<QString> args;
  bool bVar1;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringList *dirs;
  QString xdgDataDirsEnv;
  QList<QString> *in_stack_fffffffffffffef8;
  QList<QString> *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff10;
  char16_t *in_stack_ffffffffffffff18;
  QList<QString> *in_stack_ffffffffffffff28;
  long *plVar2;
  iterator in_stack_ffffffffffffff30;
  long *plVar3;
  QString *in_stack_ffffffffffffff38;
  long local_38 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qEnvironmentVariable((char *)in_stack_ffffffffffffff28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  dirsList(in_stack_ffffffffffffff38);
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x7de3d2);
  if (bVar1) {
    plVar2 = local_38;
    Qt::Literals::StringLiterals::operator____s(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
    ;
    Qt::Literals::StringLiterals::operator____s(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
    ;
    args._M_len = (size_type)plVar2;
    args._M_array = in_stack_ffffffffffffff30;
    QList<QString>::QList(in_stack_ffffffffffffff28,args);
    QList<QString>::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    QList<QString>::~QList((QList<QString> *)0x7de45d);
    plVar2 = local_38;
    plVar3 = &local_8;
    do {
      plVar3 = plVar3 + -3;
      QString::~QString((QString *)0x7de486);
    } while (plVar3 != plVar2);
  }
  QString::~QString((QString *)0x7de53d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QStringList xdgDataDirs()
{
    // http://standards.freedesktop.org/basedir-spec/latest/
    QString xdgDataDirsEnv = qEnvironmentVariable("XDG_DATA_DIRS");

    QStringList dirs = dirsList(xdgDataDirsEnv);
    if (dirs.isEmpty())
        dirs = QStringList{u"/usr/local/share"_s, u"/usr/share"_s};

    return dirs;
}